

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Lookup.cpp
# Opt level: O1

bool slang::ast::Lookup::ensureVisible
               (Symbol *symbol,ASTContext *context,optional<slang::SourceRange> sourceRange)

{
  char *pcVar1;
  char *pcVar2;
  Diagnostics *this;
  bool bVar3;
  Scope *scope;
  LookupResult result;
  LookupResult local_268;
  
  pcVar1 = local_268.selectors.
           super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
           .firstElement;
  local_268.found = (Symbol *)0x0;
  local_268.systemSubroutine._0_5_ = 0;
  local_268.systemSubroutine._5_3_ = 0;
  local_268.upwardCount = 0;
  local_268.flags.m_bits = '\0';
  local_268.selectors.
  super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  .len = 0;
  local_268.selectors.
  super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  .cap = 4;
  pcVar2 = local_268.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.
           firstElement;
  local_268.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.len = 0;
  local_268.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.cap = 2;
  local_268.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.data_ =
       (pointer)local_268.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
                super_SmallVectorBase<slang::Diagnostic>.firstElement;
  local_268.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.len = 0;
  local_268.diagnostics.super_SmallVector<slang::Diagnostic,_2UL>.
  super_SmallVectorBase<slang::Diagnostic>.cap = 2;
  scope = (context->scope).ptr;
  local_268.selectors.
  super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
  .data_ = (pointer)pcVar1;
  local_268.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.data_ =
       (pointer)pcVar2;
  bVar3 = anon_unknown_39::checkVisibility(symbol,scope,sourceRange,&local_268);
  this = &local_268.diagnostics;
  if (!bVar3) {
    scope = (Scope *)this;
    Compilation::addDiagnostics(((context->scope).ptr)->compilation,this);
  }
  SmallVectorBase<slang::Diagnostic>::cleanup
            ((SmallVectorBase<slang::Diagnostic> *)this,(EVP_PKEY_CTX *)scope);
  if (local_268.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>.data_ !=
      (pointer)pcVar2) {
    operator_delete(local_268.path.super_SmallVectorBase<slang::ast::HierarchicalReference::Element>
                    .data_);
  }
  if (local_268.selectors.
      super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
      .data_ != (pointer)pcVar1) {
    operator_delete(local_268.selectors.
                    super_SmallVectorBase<std::variant<const_slang::syntax::ElementSelectSyntax_*,_slang::ast::LookupResult::MemberSelector>_>
                    .data_);
  }
  return bVar3;
}

Assistant:

bool Lookup::ensureVisible(const Symbol& symbol, const ASTContext& context,
                           std::optional<SourceRange> sourceRange) {
    LookupResult result;
    if (checkVisibility(symbol, *context.scope, sourceRange, result))
        return true;

    result.reportDiags(context);
    return false;
}